

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_options(void)

{
  char local_38 [8];
  char name [40];
  uint8_t value;
  uint8_t b;
  
  rd_byte((uint8_t *)(name + 0x27));
  (player->opts).delay_factor = name[0x27];
  rd_byte((uint8_t *)(name + 0x27));
  (player->opts).hitpoint_warn = name[0x27];
  rd_byte((uint8_t *)(name + 0x27));
  (player->opts).lazymove_delay = name[0x27];
  if (angband_term[0] == (term *)0x0) {
    strip_bytes(1);
  }
  else {
    rd_byte((uint8_t *)(name + 0x27));
    if (2 < (byte)name[0x27]) {
      name[0x27] = '\0';
    }
    angband_term[0]->sidebar_mode = (uint)(byte)name[0x27];
  }
  while (rd_string(local_38,0x28), local_38[0] != '\0') {
    rd_byte((uint8_t *)(name + 0x26));
    option_set(local_38,(uint)(name[0x26] != '\0'));
  }
  return L'\0';
}

Assistant:

int rd_options(void)
{
	uint8_t b;

	/*** Special info */

	/* Read "delay_factor" */
	rd_byte(&b);
	player->opts.delay_factor = b;

	/* Read "hitpoint_warn" */
	rd_byte(&b);
	player->opts.hitpoint_warn = b;

	/* Read lazy movement delay */
	rd_byte(&b);
	player->opts.lazymove_delay = b;

	/* Read sidebar mode (if it's an actual game) */
	if (angband_term[0]) {
		rd_byte(&b);
		if (b >= SIDEBAR_MAX) b = SIDEBAR_LEFT;
		SIDEBAR_MODE = b;
	} else {
		strip_bytes(1);
	}


	/* Read options */
	while (1) {
		uint8_t value;
		char name[40];
		rd_string(name, sizeof name);

		if (!name[0])
			break;

		rd_byte(&value);
		option_set(name, !!value);
	}

	return 0;
}